

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void __thiscall
pdqsort_detail::
sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
          (pdqsort_detail *this,
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          a,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
            b,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
              c,anon_class_16_2_a9e7a8bd comp)

{
  anon_class_16_2_a9e7a8bd comp_00;
  anon_class_16_2_a9e7a8bd comp_01;
  anon_class_16_2_a9e7a8bd comp_02;
  HighsTableauSeparator *pHVar1;
  
  comp_00.this = (HighsTableauSeparator *)comp.edgeWt;
  comp_00.edgeWt = (double **)comp_00.this;
  pHVar1 = comp_00.this;
  sort2<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
            (this,a,c,comp_00);
  comp_01.this = pHVar1;
  comp_01.edgeWt = (double **)comp_00.this;
  sort2<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
            ((pdqsort_detail *)a._M_current,b,c,comp_01);
  comp_02.this = pHVar1;
  comp_02.edgeWt = (double **)comp_00.this;
  sort2<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
            (this,a,c,comp_02);
  return;
}

Assistant:

inline void sort3(Iter a, Iter b, Iter c, Compare comp) {
        sort2(a, b, comp);
        sort2(b, c, comp);
        sort2(a, b, comp);
    }